

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O3

void __thiscall jaegertracing::thrift::Tag::Tag(Tag *this,Tag *other1)

{
  *(undefined ***)this = &PTR__Tag_002740a8;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  (this->vStr)._M_dataplus._M_p = (pointer)&(this->vStr).field_2;
  (this->vStr)._M_string_length = 0;
  (this->vStr).field_2._M_local_buf[0] = '\0';
  (this->vBinary)._M_dataplus._M_p = (pointer)&(this->vBinary).field_2;
  (this->vBinary)._M_string_length = 0;
  (this->vBinary).field_2._M_local_buf[0] = '\0';
  this->__isset = (_Tag__isset)((byte)this->__isset & 0xe0);
  std::__cxx11::string::_M_assign((string *)&this->key);
  this->vType = other1->vType;
  std::__cxx11::string::_M_assign((string *)&this->vStr);
  this->vDouble = other1->vDouble;
  this->vBool = other1->vBool;
  this->vLong = other1->vLong;
  std::__cxx11::string::_M_assign((string *)&this->vBinary);
  this->__isset = other1->__isset;
  return;
}

Assistant:

Tag::Tag(const Tag& other1) {
  key = other1.key;
  vType = other1.vType;
  vStr = other1.vStr;
  vDouble = other1.vDouble;
  vBool = other1.vBool;
  vLong = other1.vLong;
  vBinary = other1.vBinary;
  __isset = other1.__isset;
}